

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O0

char * Mio_LibDeriveSop(int nVars,Vec_Int_t *vExpr,Vec_Str_t *vStr)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *local_b8;
  Vec_Int_t *local_a8;
  Vec_Int_t *local_a0;
  Vec_Int_t *local_90;
  int fCompl1;
  int fCompl0;
  int Index1;
  int Index0;
  int i;
  Vec_Ptr_t *vTemp;
  Vec_Ptr_t *vSops1;
  Vec_Ptr_t *vSops0;
  Vec_Int_t *vSop;
  Vec_Str_t *vStr_local;
  Vec_Int_t *vExpr_local;
  char *pcStack_10;
  int nVars_local;
  
  Vec_StrClear(vStr);
  iVar1 = Exp_IsConst0(vExpr);
  if (iVar1 == 0) {
    iVar1 = Exp_IsConst1(vExpr);
    if (iVar1 == 0) {
      iVar1 = Exp_IsLit(vExpr);
      if (iVar1 == 0) {
        iVar1 = Exp_NodeNum(vExpr);
        vSops1 = Vec_PtrAlloc(nVars + iVar1);
        iVar1 = Exp_NodeNum(vExpr);
        pVVar5 = Vec_PtrAlloc(nVars + iVar1);
        for (Index1 = 0; Index1 < nVars; Index1 = Index1 + 1) {
          pVVar6 = Mio_SopVar0(Index1);
          Vec_PtrPush(vSops1,pVVar6);
          pVVar6 = Mio_SopVar1(Index1);
          Vec_PtrPush(pVVar5,pVVar6);
        }
        Index1 = 0;
        while( true ) {
          iVar1 = Exp_NodeNum(vExpr);
          if (iVar1 <= Index1) break;
          iVar1 = Vec_IntEntry(vExpr,Index1 << 1);
          iVar1 = iVar1 >> 1;
          iVar2 = Vec_IntEntry(vExpr,Index1 * 2 + 1);
          iVar2 = iVar2 >> 1;
          uVar3 = Vec_IntEntry(vExpr,Index1 << 1);
          uVar4 = Vec_IntEntry(vExpr,Index1 * 2 + 1);
          if ((uVar3 & 1) == 0) {
            local_90 = (Vec_Int_t *)Vec_PtrEntry(pVVar5,iVar1);
          }
          else {
            local_90 = (Vec_Int_t *)Vec_PtrEntry(vSops1,iVar1);
          }
          if ((uVar4 & 1) == 0) {
            local_a0 = (Vec_Int_t *)Vec_PtrEntry(pVVar5,iVar2);
          }
          else {
            local_a0 = (Vec_Int_t *)Vec_PtrEntry(vSops1,iVar2);
          }
          pVVar6 = Mio_SopCoverAnd(local_90,local_a0);
          Vec_PtrPush(pVVar5,pVVar6);
          if ((uVar3 & 1) == 0) {
            local_a8 = (Vec_Int_t *)Vec_PtrEntry(vSops1,iVar1);
          }
          else {
            local_a8 = (Vec_Int_t *)Vec_PtrEntry(pVVar5,iVar1);
          }
          if ((uVar4 & 1) == 0) {
            local_b8 = (Vec_Int_t *)Vec_PtrEntry(vSops1,iVar2);
          }
          else {
            local_b8 = (Vec_Int_t *)Vec_PtrEntry(pVVar5,iVar2);
          }
          pVVar6 = Mio_SopCoverOr(local_a8,local_b8);
          Vec_PtrPush(vSops1,pVVar6);
          Index1 = Index1 + 1;
        }
        uVar3 = Vec_IntEntryLast(vExpr);
        vTemp = pVVar5;
        if ((uVar3 & 1) != 0) {
          vTemp = vSops1;
          vSops1 = pVVar5;
        }
        pVVar6 = (Vec_Int_t *)Vec_PtrEntryLast(vSops1);
        iVar1 = Vec_IntSize(pVVar6);
        pVVar6 = (Vec_Int_t *)Vec_PtrEntryLast(vTemp);
        iVar2 = Vec_IntSize(pVVar6);
        if (iVar1 < iVar2) {
          vSops0 = (Vec_Ptr_t *)Vec_PtrEntryLast(vSops1);
        }
        else {
          vSops0 = (Vec_Ptr_t *)Vec_PtrEntryLast(vTemp);
        }
        pVVar5 = (Vec_Ptr_t *)Vec_PtrEntryLast(vTemp);
        Mio_SopDeriveFromArray((Vec_Int_t *)vSops0,nVars,vStr,(uint)(vSops0 == pVVar5));
        Vec_VecFree((Vec_Vec_t *)vSops1);
        Vec_VecFree((Vec_Vec_t *)vTemp);
        pcStack_10 = Vec_StrArray(vStr);
      }
      else {
        for (Index1 = 0; Index1 < nVars; Index1 = Index1 + 1) {
          Vec_StrPush(vStr,'-');
        }
        Vec_StrPrintStr(vStr," 1\n");
        Vec_StrPush(vStr,'\0');
        iVar1 = Vec_IntEntry(vExpr,0);
        if (nVars <= iVar1 >> 1) {
          __assert_fail("(Vec_IntEntry(vExpr,0) >> 1) < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioSop.c"
                        ,0x119,"char *Mio_LibDeriveSop(int, Vec_Int_t *, Vec_Str_t *)");
        }
        iVar1 = Vec_IntEntry(vExpr,0);
        iVar2 = Vec_IntEntry(vExpr,0);
        Vec_StrWriteEntry(vStr,iVar1 >> 1,'1' - ((byte)iVar2 & 1));
        pcStack_10 = Vec_StrArray(vStr);
      }
    }
    else {
      Vec_StrPrintStr(vStr," 1\n");
      Vec_StrPush(vStr,'\0');
      pcStack_10 = Vec_StrArray(vStr);
    }
  }
  else {
    Vec_StrPrintStr(vStr," 0\n");
    Vec_StrPush(vStr,'\0');
    pcStack_10 = Vec_StrArray(vStr);
  }
  return pcStack_10;
}

Assistant:

char * Mio_LibDeriveSop( int nVars, Vec_Int_t * vExpr, Vec_Str_t * vStr )
{
    Vec_Int_t * vSop;
    Vec_Ptr_t * vSops0, * vSops1, * vTemp;
    int i, Index0, Index1, fCompl0, fCompl1;
    Vec_StrClear( vStr );
    if ( Exp_IsConst0(vExpr) )
    {
        Vec_StrPrintStr( vStr, " 0\n" );
        Vec_StrPush( vStr, '\0' );
        return Vec_StrArray( vStr );
    }
    if ( Exp_IsConst1(vExpr) )
    {
        Vec_StrPrintStr( vStr, " 1\n" );
        Vec_StrPush( vStr, '\0' );
        return Vec_StrArray( vStr );
    }
    if ( Exp_IsLit(vExpr) )
    {
        for ( i = 0; i < nVars; i++ )
            Vec_StrPush( vStr, '-' );
        Vec_StrPrintStr( vStr, " 1\n" );
        Vec_StrPush( vStr, '\0' );
        assert( (Vec_IntEntry(vExpr,0) >> 1) < nVars );
        Vec_StrWriteEntry( vStr, Vec_IntEntry(vExpr,0) >> 1, (char)('1' - (Vec_IntEntry(vExpr,0) & 1)) );
        return Vec_StrArray( vStr );
    }
    vSops0 = Vec_PtrAlloc( nVars + Exp_NodeNum(vExpr) );
    vSops1 = Vec_PtrAlloc( nVars + Exp_NodeNum(vExpr) );
    for ( i = 0; i < nVars; i++ )
    {
        Vec_PtrPush( vSops0, Mio_SopVar0(i) );
        Vec_PtrPush( vSops1, Mio_SopVar1(i) );
    }
    for ( i = 0; i < Exp_NodeNum(vExpr); i++ )
    {
        Index0  = Vec_IntEntry( vExpr, 2*i+0 ) >> 1;
        Index1  = Vec_IntEntry( vExpr, 2*i+1 ) >> 1;
        fCompl0 = Vec_IntEntry( vExpr, 2*i+0 ) & 1;
        fCompl1 = Vec_IntEntry( vExpr, 2*i+1 ) & 1;
        // positive polarity
        vSop = Mio_SopCoverAnd( fCompl0 ? (Vec_Int_t *)Vec_PtrEntry(vSops0, Index0) : (Vec_Int_t *)Vec_PtrEntry(vSops1, Index0),
                                fCompl1 ? (Vec_Int_t *)Vec_PtrEntry(vSops0, Index1) : (Vec_Int_t *)Vec_PtrEntry(vSops1, Index1) );
        Vec_PtrPush( vSops1, vSop );
        // negative polarity
        vSop = Mio_SopCoverOr( fCompl0 ? (Vec_Int_t *)Vec_PtrEntry(vSops1, Index0) : (Vec_Int_t *)Vec_PtrEntry(vSops0, Index0),
                               fCompl1 ? (Vec_Int_t *)Vec_PtrEntry(vSops1, Index1) : (Vec_Int_t *)Vec_PtrEntry(vSops0, Index1) );
        Vec_PtrPush( vSops0, vSop );
    }
    // complement
    if ( Vec_IntEntryLast(vExpr) & 1 )
    {
        vTemp  = vSops0;
        vSops0 = vSops1;
        vSops1 = vTemp;
    }
    // select the best polarity
    if ( Vec_IntSize( (Vec_Int_t *)Vec_PtrEntryLast(vSops0) ) < Vec_IntSize( (Vec_Int_t *)Vec_PtrEntryLast(vSops1) ) )
        vSop = (Vec_Int_t *)Vec_PtrEntryLast(vSops0);
    else
        vSop = (Vec_Int_t *)Vec_PtrEntryLast(vSops1);
    // convert positive polarity into SOP
    Mio_SopDeriveFromArray( vSop, nVars, vStr, (vSop == Vec_PtrEntryLast(vSops1)) );
    Vec_VecFree( (Vec_Vec_t *)vSops0 );
    Vec_VecFree( (Vec_Vec_t *)vSops1 );
    return Vec_StrArray( vStr );
}